

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool ON_NurbsSurface::ON_Internal_MakeKnotVectorsCompatible
               (ON_NurbsCurve *nurbs_curveA,ON_NurbsCurve *nurbs_curveB)

{
  ON_Interval *this;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  ON_NurbsCurve *pOVar11;
  ON_NurbsCurve *this_00;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  ON_Interval span;
  int local_8c;
  ON_Interval local_50;
  ON_Interval local_40;
  
  this_00 = nurbs_curveA;
  pOVar11 = nurbs_curveB;
  if (nurbs_curveB->m_order < nurbs_curveA->m_order) {
    this_00 = nurbs_curveB;
    pOVar11 = nurbs_curveA;
  }
  iVar2 = (*(pOVar11->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])();
  ON_NurbsCurve::IncreaseDegree(this_00,iVar2);
  if (nurbs_curveA->m_order == nurbs_curveB->m_order) {
    (*(nurbs_curveA->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
              (nurbs_curveA);
    (*(nurbs_curveB->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
              (nurbs_curveB);
    dVar13 = ON_Interval::Length(&local_50);
    dVar14 = ON_Interval::Length(&local_40);
    pOVar11 = nurbs_curveB;
    this = &local_50;
    if (dVar13 < dVar14) {
      pOVar11 = nurbs_curveA;
      this = &local_40;
    }
    pdVar8 = ON_Interval::operator[](this,0);
    dVar13 = *pdVar8;
    pdVar8 = ON_Interval::operator[](this,1);
    iVar2 = (*(pOVar11->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                      (dVar13,*pdVar8,pOVar11);
    if ((char)iVar2 == '\0') {
      return false;
    }
    iVar2 = nurbs_curveA->m_order;
    ON_Interval::ON_Interval(&local_50);
    iVar3 = ON_NurbsCurve::KnotCount(nurbs_curveA);
    iVar4 = ON_NurbsCurve::KnotCount(nurbs_curveB);
    iVar5 = (*(nurbs_curveA->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x35]
            )(nurbs_curveA);
    if (((char)iVar5 != '\0') ||
       (iVar5 = (*(nurbs_curveB->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                  [0x35])(nurbs_curveB), (char)iVar5 != '\0')) {
      bVar1 = true;
      if (2 < iVar2) {
        bVar1 = true;
        lVar10 = 1;
        do {
          if (nurbs_curveA->m_knot[lVar10 + -1] != nurbs_curveB->m_knot[lVar10 + -1]) {
            bVar1 = false;
          }
          if (NAN(nurbs_curveA->m_knot[lVar10 + -1]) || NAN(nurbs_curveB->m_knot[lVar10 + -1])) {
            bVar1 = false;
          }
        } while ((lVar10 < (long)iVar2 + -2) && (lVar10 = lVar10 + 1, bVar1));
      }
      iVar5 = nurbs_curveB->m_cv_count;
      if (iVar5 < iVar4 && nurbs_curveA->m_cv_count < iVar3) {
        lVar10 = (long)nurbs_curveA->m_cv_count;
        while( true ) {
          iVar5 = iVar5 + 1;
          if (!bVar1) break;
          if (nurbs_curveA->m_knot[lVar10] != nurbs_curveB->m_knot[lVar10]) {
            bVar1 = false;
          }
          if (NAN(nurbs_curveA->m_knot[lVar10]) || NAN(nurbs_curveB->m_knot[lVar10])) {
            bVar1 = false;
          }
          if (((long)iVar3 <= lVar10 + 1) || (lVar10 = lVar10 + 1, iVar4 <= iVar5)) break;
        }
      }
      if (bVar1) goto LAB_00550b65;
    }
    bVar1 = ON_NurbsCurve::ClampEnd(nurbs_curveA,2);
    if ((bVar1) && (bVar1 = ON_NurbsCurve::ClampEnd(nurbs_curveB,2), bVar1)) {
LAB_00550b65:
      iVar5 = iVar2 + -1;
      iVar4 = (iVar3 - (iVar2 * 2 + -2)) + iVar4;
      do {
        iVar3 = iVar5 + -1;
        lVar10 = (long)iVar5;
        do {
          iVar6 = nurbs_curveA->m_cv_count;
          if (((iVar6 + -1 <= iVar5) && (nurbs_curveB->m_cv_count + -1 <= iVar5)) ||
             (iVar6 <= iVar5)) {
LAB_00550ecf:
            if (iVar6 != nurbs_curveB->m_cv_count) {
              return false;
            }
            uVar7 = ON_NurbsCurve::KnotCount(nurbs_curveA);
            if (0 < (int)uVar7) {
              lVar10 = 0;
              while( true ) {
                dVar13 = nurbs_curveA->m_knot[lVar10];
                dVar14 = nurbs_curveB->m_knot[lVar10];
                bVar1 = (bool)(-(dVar13 == dVar14) & 1);
                if (dVar13 != dVar14) {
                  return bVar1;
                }
                if (NAN(dVar13) || NAN(dVar14)) break;
                bVar12 = (ulong)uVar7 - 1 == lVar10;
                lVar10 = lVar10 + 1;
                if (bVar12) {
                  return bVar1;
                }
              }
              return bVar1;
            }
            return true;
          }
          pdVar8 = nurbs_curveA->m_knot;
          dVar13 = pdVar8[iVar3];
          dVar14 = nurbs_curveB->m_knot[iVar3];
          if (((dVar13 != dVar14) || (NAN(dVar13) || NAN(dVar14))) ||
             (nurbs_curveB->m_cv_count <= iVar5)) goto LAB_00550ecf;
          dVar16 = pdVar8[lVar10];
          if ((dVar16 == dVar13) && (!NAN(dVar16) && !NAN(dVar13))) {
            return false;
          }
          dVar13 = nurbs_curveB->m_knot[lVar10];
          if ((dVar13 == dVar14) && (!NAN(dVar13) && !NAN(dVar14))) {
            return false;
          }
          local_8c = ON_KnotMultiplicity(iVar2,iVar6,pdVar8,iVar5);
          iVar6 = ON_KnotMultiplicity(iVar2,nurbs_curveB->m_cv_count,nurbs_curveB->m_knot,iVar5);
          if (dVar13 <= dVar16) {
            if (dVar13 < dVar16) {
              ON_Interval::Set(&local_50,nurbs_curveA->m_knot[iVar3],nurbs_curveA->m_knot[lVar10]);
              dVar15 = ON_Interval::Length(&local_50);
              dVar14 = nurbs_curveA->m_knot[iVar3];
              dVar16 = nurbs_curveA->m_knot[lVar10];
              pdVar8 = ON_Interval::operator[](&local_50,1);
              if ((ABS(dVar16) + ABS(dVar14) + dVar15) * -1.490116119385e-08 + *pdVar8 <= dVar13) {
                if (0 < local_8c) {
                  pdVar8 = nurbs_curveA->m_knot;
                  lVar9 = lVar10;
                  do {
                    pdVar8[lVar9] = dVar13;
                    lVar9 = lVar9 + 1;
                  } while (lVar9 < local_8c + iVar5);
                }
              }
              else {
                ON_NurbsCurve::ReserveKnotCapacity(nurbs_curveA,iVar4);
                ON_NurbsCurve::InsertKnot(nurbs_curveA,dVar13,iVar6);
              }
              dVar16 = nurbs_curveA->m_knot[lVar10];
              local_8c = ON_KnotMultiplicity(iVar2,nurbs_curveA->m_cv_count,nurbs_curveA->m_knot,
                                             iVar5);
            }
          }
          else {
            ON_Interval::Set(&local_50,nurbs_curveB->m_knot[iVar3],nurbs_curveB->m_knot[lVar10]);
            dVar15 = ON_Interval::Length(&local_50);
            dVar13 = nurbs_curveB->m_knot[iVar3];
            dVar14 = nurbs_curveB->m_knot[lVar10];
            pdVar8 = ON_Interval::operator[](&local_50,1);
            if ((ABS(dVar14) + ABS(dVar13) + dVar15) * -1.490116119385e-08 + *pdVar8 <= dVar16) {
              if (0 < iVar6) {
                pdVar8 = nurbs_curveB->m_knot;
                lVar9 = lVar10;
                do {
                  pdVar8[lVar9] = dVar16;
                  lVar9 = lVar9 + 1;
                } while (lVar9 < iVar6 + iVar5);
              }
            }
            else {
              ON_NurbsCurve::ReserveKnotCapacity(nurbs_curveB,iVar4);
              ON_NurbsCurve::InsertKnot(nurbs_curveB,dVar16,local_8c);
            }
            dVar13 = nurbs_curveB->m_knot[lVar10];
            iVar6 = ON_KnotMultiplicity(iVar2,nurbs_curveB->m_cv_count,nurbs_curveB->m_knot,iVar5);
          }
          if (dVar16 != dVar13) {
            return false;
          }
          if (NAN(dVar16) || NAN(dVar13)) {
            return false;
          }
        } while ((dVar16 != dVar13) || (NAN(dVar16) || NAN(dVar13)));
        if (local_8c < iVar6) {
          ON_NurbsCurve::ReserveKnotCapacity(nurbs_curveA,iVar4);
          bVar1 = ON_NurbsCurve::InsertKnot(nurbs_curveA,dVar16,iVar6);
          local_8c = iVar6;
LAB_00550ebe:
          if (bVar1 == false) {
            return false;
          }
        }
        else if (iVar6 < local_8c) {
          ON_NurbsCurve::ReserveKnotCapacity(nurbs_curveB,iVar4);
          bVar1 = ON_NurbsCurve::InsertKnot(nurbs_curveB,dVar16,local_8c);
          goto LAB_00550ebe;
        }
        iVar5 = iVar5 + local_8c;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool ON_NurbsSurface::ON_Internal_MakeKnotVectorsCompatible(
       ON_NurbsCurve& nurbs_curveA,
       ON_NurbsCurve& nurbs_curveB
       )
{
  if ( !ON_MakeDegreesCompatible( nurbs_curveA, nurbs_curveB ) )
    return false;
  if ( !ON_MakeDomainsCompatible( nurbs_curveA, nurbs_curveB ) )
    return false;

  const int order = nurbs_curveA.m_order;
  ON_Interval span;
  double ktol, a, b;
  int i, ki, multA, multB;
  int knot_countA = nurbs_curveA.KnotCount();
  int knot_countB = nurbs_curveB.KnotCount();
  int max_knot_capacity = knot_countA + knot_countB - 2*(order-1);

  bool bPeriodic = false;
  if ( nurbs_curveA.IsPeriodic() || nurbs_curveB.IsPeriodic() )
  {
    bPeriodic = true;
    for ( ki = 0; ki < order-2 && bPeriodic; ki++ )
    {
      if ( nurbs_curveA.m_knot[ki] != nurbs_curveB.m_knot[ki] )
        bPeriodic = false;
    }
    int kiA, kiB;
    for (
      kiA = nurbs_curveA.m_cv_count,
      kiB = nurbs_curveB.m_cv_count;
      kiA < knot_countA && kiB < knot_countB && bPeriodic;
      kiA++, kiB++ )
    {
      if ( nurbs_curveA.m_knot[kiA] != nurbs_curveB.m_knot[kiA] )
        bPeriodic = false;
    }
  }
  if ( !bPeriodic )
  {
    if ( !nurbs_curveA.ClampEnd(2) )
      return false;
    if ( !nurbs_curveB.ClampEnd(2) )
      return false;
  }

  ki = order-1; 
  while ( (ki < nurbs_curveA.m_cv_count-1 || ki < nurbs_curveB.m_cv_count-1)
          && nurbs_curveA.m_knot[ki-1] == nurbs_curveB.m_knot[ki-1]
          && ki <= nurbs_curveA.m_cv_count-1
          && ki <= nurbs_curveB.m_cv_count-1
          )
  {
    a = nurbs_curveA.m_knot[ki];
    if ( a == nurbs_curveA.m_knot[ki-1] )
      return false;
    b = nurbs_curveB.m_knot[ki];
    if ( b == nurbs_curveB.m_knot[ki-1] )
      return false;
    multA = ON_KnotMultiplicity( order, nurbs_curveA.m_cv_count, nurbs_curveA.m_knot, ki );
    multB = ON_KnotMultiplicity( order, nurbs_curveB.m_cv_count, nurbs_curveB.m_knot, ki );

    if ( a < b )
    {
      // insert a in nurbs_curveB
      span.Set(nurbs_curveB.m_knot[ki-1], nurbs_curveB.m_knot[ki] );
      ktol = ON_SQRT_EPSILON*(span.Length() + fabs(nurbs_curveB.m_knot[ki-1]) + fabs(nurbs_curveB.m_knot[ki]) );
      if ( a >= span[1] - ktol )
      {
        for ( i = ki; i < ki+multB; i++ )
          nurbs_curveB.m_knot[i] = a;          
      }
      else
      {
        nurbs_curveB.ReserveKnotCapacity( max_knot_capacity );
        nurbs_curveB.InsertKnot( a, multA );
      }
      b = nurbs_curveB.m_knot[ki];
      multB = ON_KnotMultiplicity( order, nurbs_curveB.m_cv_count, nurbs_curveB.m_knot, ki );
    }
    else if ( b < a )
    {
      // insert b in nurbs_curveA
      span.Set(nurbs_curveA.m_knot[ki-1], nurbs_curveA.m_knot[ki] );
      ktol = ON_SQRT_EPSILON*(span.Length() + fabs(nurbs_curveA.m_knot[ki-1]) + fabs(nurbs_curveA.m_knot[ki]) );
      if ( b >= span[1] - ktol )
      {
        for ( i = ki; i < ki+multA; i++ )
          nurbs_curveA.m_knot[i] = b;
      }
      else
      {
        nurbs_curveA.ReserveKnotCapacity( max_knot_capacity );
        nurbs_curveA.InsertKnot( b, multB );
      }
      a = nurbs_curveA.m_knot[ki];
      multA = ON_KnotMultiplicity( order, nurbs_curveA.m_cv_count, nurbs_curveA.m_knot, ki );
    }

    if ( a != b )
      return false;

    if ( a == b )
    {
      if ( multA < multB )
      {
        nurbs_curveA.ReserveKnotCapacity( max_knot_capacity );
        if ( !nurbs_curveA.InsertKnot( a, multB ) )
          return false;
        multA = multB;
      }
      else if ( multB < multA )
      {
        nurbs_curveB.ReserveKnotCapacity( max_knot_capacity );
        if ( !nurbs_curveB.InsertKnot( a, multA ) )
          return false;
        multB = multA;
      }
      ki += multA;
    }
  }

  if ( nurbs_curveA.m_cv_count != nurbs_curveB.m_cv_count )
    return false;
  knot_countA = nurbs_curveA.KnotCount();
  for ( ki = 0; ki < knot_countA; ki++ )
  {
    if ( nurbs_curveA.m_knot[ki] != nurbs_curveB.m_knot[ki] )
      return false;
  }

  return true;
}